

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::genComputeSource(SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  allocator<char> local_371;
  string local_370;
  undefined1 local_350 [40];
  string local_328;
  ostringstream bufBad;
  string local_300 [368];
  ostringstream bufGood;
  
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufGood);
  poVar2 = std::operator<<((ostream *)&bufGood,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1u, std140) uniform BufferName\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorA;\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorB;\n");
  poVar2 = std::operator<<(poVar2,"} b_instance;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 read_colors[4];\n");
  poVar2 = std::operator<<(poVar2,"} b_out;\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
  poVar2 = std::operator<<(poVar2,"\tif (quadrant_id == 1 || quadrant_id == 2)\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorA;\n");
  poVar2 = std::operator<<(poVar2,"\telse\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorB;\n");
  poVar2 = std::operator<<(poVar2,"\tb_out.read_colors[gl_WorkGroupID.x] = result_color;\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"compute_good",(allocator<char> *)&local_328);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,(string *)local_350);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&bufBad,&local_370);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&bufBad);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)local_350);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufBad);
  poVar2 = std::operator<<((ostream *)&bufBad,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"");
  poVar2 = std::operator<<(poVar2,
                           "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1u, std140) uniform BufferName\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorA;\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 colorB;\n");
  poVar2 = std::operator<<(poVar2,"} b_instance;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 read_colors[4];\n");
  poVar2 = std::operator<<(poVar2,"} b_out;\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp int quadrant_id = int(gl_WorkGroupID.x);\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 result_color;\n");
  poVar2 = std::operator<<(poVar2,"\tif (quadrant_id == 1 || quadrant_id == 2)\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorA;\n");
  poVar2 = std::operator<<(poVar2,"\telse\n");
  poVar2 = std::operator<<(poVar2,"\t\tresult_color = b_instance.colorB;\n");
  poVar2 = std::operator<<(poVar2,
                           "\tb_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"compute_bad",&local_371);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_370);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_350,&local_328);
  glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_350);
  std::__cxx11::string::~string((string *)(local_350 + 8));
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufBad);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufGood);
  return;
}

Assistant:

void genComputeSource (SourceCollections& programCollection)
{
	const char* const						versionDecl				= glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	std::ostringstream						bufGood;

	bufGood << versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = result_color;\n"
	<< "}\n";

	programCollection.glslSources.add("compute_good") << glu::ComputeSource(bufGood.str());

	std::ostringstream	bufBad;

	bufBad	<< versionDecl << "\n"
	<< ""
	<< "layout(local_size_x = 1u, local_size_y = 1u, local_size_z = 1u) in;\n"
	<< "layout(set = 0, binding = 1u, std140) uniform BufferName\n"
	<< "{\n"
	<< "	highp vec4 colorA;\n"
	<< "	highp vec4 colorB;\n"
	<< "} b_instance;\n"
	<< "layout(set = 0, binding = 0, std140) writeonly buffer OutBuf\n"
	<< "{\n"
	<< "	highp vec4 read_colors[4];\n"
	<< "} b_out;\n"
	<< "void main(void)\n"
	<< "{\n"
	<< "	highp int quadrant_id = int(gl_WorkGroupID.x);\n"
	<< "	highp vec4 result_color;\n"
	<< "	if (quadrant_id == 1 || quadrant_id == 2)\n"
	<< "		result_color = b_instance.colorA;\n"
	<< "	else\n"
	<< "		result_color = b_instance.colorB;\n"
	<< "	b_out.read_colors[gl_WorkGroupID.x] = vec4(0.0, 0.0, 0.0, 0.0);\n"
	<< "}\n";

	programCollection.glslSources.add("compute_bad") << glu::ComputeSource(bufBad.str());
}